

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_mmu.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_2f8484::NesMmuTest_controller_2_Test::TestBody
          (NesMmuTest_controller_2_Test *this)

{
  StrictMock<n_e_s::core::test::MockNesController> *this_00;
  IMmu *pIVar1;
  int iVar2;
  TypedExpectation<bool_(n_e_s::core::INesController::Button)> *pTVar3;
  char *pcVar4;
  MatcherBase<n_e_s::core::INesController::Button> local_88;
  _Any_data local_70 [2];
  AssertionResult gtest_ar;
  ReturnAction<bool> local_30;
  
  this_00 = &(this->super_NesMmuTest).controller2;
  testing::Matcher<n_e_s::core::INesController::Button>::Matcher
            ((Matcher<n_e_s::core::INesController::Button> *)&local_88,A);
  n_e_s::core::test::MockNesController::gmock_get
            ((MockSpec<bool_(n_e_s::core::INesController::Button)> *)&gtest_ar,
             &this_00->super_MockNesController,
             (Matcher<n_e_s::core::INesController::Button> *)&local_88);
  testing::internal::GetWithoutMatchers();
  pTVar3 = testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::
           InternalExpectedAt((MockSpec<bool_(n_e_s::core::INesController::Button)> *)&gtest_ar,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_mmu.cpp"
                              ,0xb4,"controller2","get(INesController::Button::A)");
  testing::internal::ReturnAction<bool>::ReturnAction(&local_30,false);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<bool_(n_e_s::core::INesController::Button)> *)local_70,
             (ReturnAction *)&local_30);
  testing::internal::TypedExpectation<bool_(n_e_s::core::INesController::Button)>::WillOnce
            (pTVar3,(Action<bool_(n_e_s::core::INesController::Button)> *)local_70);
  std::_Function_base::~_Function_base((_Function_base *)local_70);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_30.value_.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  testing::internal::MatcherBase<n_e_s::core::INesController::Button>::~MatcherBase
            ((MatcherBase<n_e_s::core::INesController::Button> *)&gtest_ar.message_);
  testing::internal::MatcherBase<n_e_s::core::INesController::Button>::~MatcherBase(&local_88);
  local_70[0]._0_4_ = 0x40;
  pIVar1 = (this->super_NesMmuTest).mmu._M_t.
           super___uniq_ptr_impl<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>._M_t.
           super__Tuple_impl<0UL,_n_e_s::core::IMmu_*,_std::default_delete<n_e_s::core::IMmu>_>.
           super__Head_base<0UL,_n_e_s::core::IMmu_*,_false>._M_head_impl;
  iVar2 = (*pIVar1->_vptr_IMmu[3])(pIVar1,0x4017);
  local_88.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface._0_1_ = (undefined1)iVar2
  ;
  testing::internal::CmpHelperEQ<int,unsigned_char>
            ((internal *)&gtest_ar,"0x40","mmu->read_byte(0x4017)",(int *)local_70[0]._M_pod_data,
             (uchar *)&local_88);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_70);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_mmu.cpp"
               ,0xb6,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
    if ((long *)CONCAT44(local_70[0]._4_4_,local_70[0]._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_70[0]._4_4_,local_70[0]._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  testing::Matcher<n_e_s::core::INesController::Button>::Matcher
            ((Matcher<n_e_s::core::INesController::Button> *)&local_88,B);
  n_e_s::core::test::MockNesController::gmock_get
            ((MockSpec<bool_(n_e_s::core::INesController::Button)> *)&gtest_ar,
             &this_00->super_MockNesController,
             (Matcher<n_e_s::core::INesController::Button> *)&local_88);
  testing::internal::GetWithoutMatchers();
  pTVar3 = testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::
           InternalExpectedAt((MockSpec<bool_(n_e_s::core::INesController::Button)> *)&gtest_ar,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_mmu.cpp"
                              ,0xb7,"controller2","get(INesController::Button::B)");
  testing::internal::ReturnAction<bool>::ReturnAction(&local_30,false);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<bool_(n_e_s::core::INesController::Button)> *)local_70,
             (ReturnAction *)&local_30);
  testing::internal::TypedExpectation<bool_(n_e_s::core::INesController::Button)>::WillOnce
            (pTVar3,(Action<bool_(n_e_s::core::INesController::Button)> *)local_70);
  std::_Function_base::~_Function_base((_Function_base *)local_70);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_30.value_.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  testing::internal::MatcherBase<n_e_s::core::INesController::Button>::~MatcherBase
            ((MatcherBase<n_e_s::core::INesController::Button> *)&gtest_ar.message_);
  testing::internal::MatcherBase<n_e_s::core::INesController::Button>::~MatcherBase(&local_88);
  local_70[0]._0_4_ = 0x40;
  pIVar1 = (this->super_NesMmuTest).mmu._M_t.
           super___uniq_ptr_impl<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>._M_t.
           super__Tuple_impl<0UL,_n_e_s::core::IMmu_*,_std::default_delete<n_e_s::core::IMmu>_>.
           super__Head_base<0UL,_n_e_s::core::IMmu_*,_false>._M_head_impl;
  iVar2 = (*pIVar1->_vptr_IMmu[3])(pIVar1,0x4017);
  local_88.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface._0_1_ = (undefined1)iVar2
  ;
  testing::internal::CmpHelperEQ<int,unsigned_char>
            ((internal *)&gtest_ar,"0x40","mmu->read_byte(0x4017)",(int *)local_70[0]._M_pod_data,
             (uchar *)&local_88);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_70);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_mmu.cpp"
               ,0xb9,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
    if ((long *)CONCAT44(local_70[0]._4_4_,local_70[0]._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_70[0]._4_4_,local_70[0]._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  testing::Matcher<n_e_s::core::INesController::Button>::Matcher
            ((Matcher<n_e_s::core::INesController::Button> *)&local_88,Select);
  n_e_s::core::test::MockNesController::gmock_get
            ((MockSpec<bool_(n_e_s::core::INesController::Button)> *)&gtest_ar,
             &this_00->super_MockNesController,
             (Matcher<n_e_s::core::INesController::Button> *)&local_88);
  testing::internal::GetWithoutMatchers();
  pTVar3 = testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::
           InternalExpectedAt((MockSpec<bool_(n_e_s::core::INesController::Button)> *)&gtest_ar,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_mmu.cpp"
                              ,0xba,"controller2","get(INesController::Button::Select)");
  testing::internal::ReturnAction<bool>::ReturnAction(&local_30,false);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<bool_(n_e_s::core::INesController::Button)> *)local_70,
             (ReturnAction *)&local_30);
  testing::internal::TypedExpectation<bool_(n_e_s::core::INesController::Button)>::WillOnce
            (pTVar3,(Action<bool_(n_e_s::core::INesController::Button)> *)local_70);
  std::_Function_base::~_Function_base((_Function_base *)local_70);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_30.value_.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  testing::internal::MatcherBase<n_e_s::core::INesController::Button>::~MatcherBase
            ((MatcherBase<n_e_s::core::INesController::Button> *)&gtest_ar.message_);
  testing::internal::MatcherBase<n_e_s::core::INesController::Button>::~MatcherBase(&local_88);
  local_70[0]._0_4_ = 0x40;
  pIVar1 = (this->super_NesMmuTest).mmu._M_t.
           super___uniq_ptr_impl<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>._M_t.
           super__Tuple_impl<0UL,_n_e_s::core::IMmu_*,_std::default_delete<n_e_s::core::IMmu>_>.
           super__Head_base<0UL,_n_e_s::core::IMmu_*,_false>._M_head_impl;
  iVar2 = (*pIVar1->_vptr_IMmu[3])(pIVar1,0x4017);
  local_88.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface._0_1_ = (undefined1)iVar2
  ;
  testing::internal::CmpHelperEQ<int,unsigned_char>
            ((internal *)&gtest_ar,"0x40","mmu->read_byte(0x4017)",(int *)local_70[0]._M_pod_data,
             (uchar *)&local_88);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_70);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_mmu.cpp"
               ,0xbc,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
    if ((long *)CONCAT44(local_70[0]._4_4_,local_70[0]._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_70[0]._4_4_,local_70[0]._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  testing::Matcher<n_e_s::core::INesController::Button>::Matcher
            ((Matcher<n_e_s::core::INesController::Button> *)&local_88,Start);
  n_e_s::core::test::MockNesController::gmock_get
            ((MockSpec<bool_(n_e_s::core::INesController::Button)> *)&gtest_ar,
             &this_00->super_MockNesController,
             (Matcher<n_e_s::core::INesController::Button> *)&local_88);
  testing::internal::GetWithoutMatchers();
  pTVar3 = testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::
           InternalExpectedAt((MockSpec<bool_(n_e_s::core::INesController::Button)> *)&gtest_ar,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_mmu.cpp"
                              ,0xbd,"controller2","get(INesController::Button::Start)");
  testing::internal::ReturnAction<bool>::ReturnAction(&local_30,false);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<bool_(n_e_s::core::INesController::Button)> *)local_70,
             (ReturnAction *)&local_30);
  testing::internal::TypedExpectation<bool_(n_e_s::core::INesController::Button)>::WillOnce
            (pTVar3,(Action<bool_(n_e_s::core::INesController::Button)> *)local_70);
  std::_Function_base::~_Function_base((_Function_base *)local_70);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_30.value_.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  testing::internal::MatcherBase<n_e_s::core::INesController::Button>::~MatcherBase
            ((MatcherBase<n_e_s::core::INesController::Button> *)&gtest_ar.message_);
  testing::internal::MatcherBase<n_e_s::core::INesController::Button>::~MatcherBase(&local_88);
  local_70[0]._0_4_ = 0x40;
  pIVar1 = (this->super_NesMmuTest).mmu._M_t.
           super___uniq_ptr_impl<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>._M_t.
           super__Tuple_impl<0UL,_n_e_s::core::IMmu_*,_std::default_delete<n_e_s::core::IMmu>_>.
           super__Head_base<0UL,_n_e_s::core::IMmu_*,_false>._M_head_impl;
  iVar2 = (*pIVar1->_vptr_IMmu[3])(pIVar1,0x4017);
  local_88.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface._0_1_ = (undefined1)iVar2
  ;
  testing::internal::CmpHelperEQ<int,unsigned_char>
            ((internal *)&gtest_ar,"0x40","mmu->read_byte(0x4017)",(int *)local_70[0]._M_pod_data,
             (uchar *)&local_88);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_70);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_mmu.cpp"
               ,0xbf,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
    if ((long *)CONCAT44(local_70[0]._4_4_,local_70[0]._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_70[0]._4_4_,local_70[0]._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  testing::Matcher<n_e_s::core::INesController::Button>::Matcher
            ((Matcher<n_e_s::core::INesController::Button> *)&local_88,Up);
  n_e_s::core::test::MockNesController::gmock_get
            ((MockSpec<bool_(n_e_s::core::INesController::Button)> *)&gtest_ar,
             &this_00->super_MockNesController,
             (Matcher<n_e_s::core::INesController::Button> *)&local_88);
  testing::internal::GetWithoutMatchers();
  pTVar3 = testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::
           InternalExpectedAt((MockSpec<bool_(n_e_s::core::INesController::Button)> *)&gtest_ar,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_mmu.cpp"
                              ,0xc0,"controller2","get(INesController::Button::Up)");
  testing::internal::ReturnAction<bool>::ReturnAction(&local_30,false);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<bool_(n_e_s::core::INesController::Button)> *)local_70,
             (ReturnAction *)&local_30);
  testing::internal::TypedExpectation<bool_(n_e_s::core::INesController::Button)>::WillOnce
            (pTVar3,(Action<bool_(n_e_s::core::INesController::Button)> *)local_70);
  std::_Function_base::~_Function_base((_Function_base *)local_70);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_30.value_.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  testing::internal::MatcherBase<n_e_s::core::INesController::Button>::~MatcherBase
            ((MatcherBase<n_e_s::core::INesController::Button> *)&gtest_ar.message_);
  testing::internal::MatcherBase<n_e_s::core::INesController::Button>::~MatcherBase(&local_88);
  local_70[0]._0_4_ = 0x40;
  pIVar1 = (this->super_NesMmuTest).mmu._M_t.
           super___uniq_ptr_impl<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>._M_t.
           super__Tuple_impl<0UL,_n_e_s::core::IMmu_*,_std::default_delete<n_e_s::core::IMmu>_>.
           super__Head_base<0UL,_n_e_s::core::IMmu_*,_false>._M_head_impl;
  iVar2 = (*pIVar1->_vptr_IMmu[3])(pIVar1,0x4017);
  local_88.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface._0_1_ = (undefined1)iVar2
  ;
  testing::internal::CmpHelperEQ<int,unsigned_char>
            ((internal *)&gtest_ar,"0x40","mmu->read_byte(0x4017)",(int *)local_70[0]._M_pod_data,
             (uchar *)&local_88);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_70);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_mmu.cpp"
               ,0xc2,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
    if ((long *)CONCAT44(local_70[0]._4_4_,local_70[0]._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_70[0]._4_4_,local_70[0]._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  testing::Matcher<n_e_s::core::INesController::Button>::Matcher
            ((Matcher<n_e_s::core::INesController::Button> *)&local_88,Down);
  n_e_s::core::test::MockNesController::gmock_get
            ((MockSpec<bool_(n_e_s::core::INesController::Button)> *)&gtest_ar,
             &this_00->super_MockNesController,
             (Matcher<n_e_s::core::INesController::Button> *)&local_88);
  testing::internal::GetWithoutMatchers();
  pTVar3 = testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::
           InternalExpectedAt((MockSpec<bool_(n_e_s::core::INesController::Button)> *)&gtest_ar,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_mmu.cpp"
                              ,0xc3,"controller2","get(INesController::Button::Down)");
  testing::internal::ReturnAction<bool>::ReturnAction(&local_30,false);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<bool_(n_e_s::core::INesController::Button)> *)local_70,
             (ReturnAction *)&local_30);
  testing::internal::TypedExpectation<bool_(n_e_s::core::INesController::Button)>::WillOnce
            (pTVar3,(Action<bool_(n_e_s::core::INesController::Button)> *)local_70);
  std::_Function_base::~_Function_base((_Function_base *)local_70);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_30.value_.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  testing::internal::MatcherBase<n_e_s::core::INesController::Button>::~MatcherBase
            ((MatcherBase<n_e_s::core::INesController::Button> *)&gtest_ar.message_);
  testing::internal::MatcherBase<n_e_s::core::INesController::Button>::~MatcherBase(&local_88);
  local_70[0]._0_4_ = 0x40;
  pIVar1 = (this->super_NesMmuTest).mmu._M_t.
           super___uniq_ptr_impl<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>._M_t.
           super__Tuple_impl<0UL,_n_e_s::core::IMmu_*,_std::default_delete<n_e_s::core::IMmu>_>.
           super__Head_base<0UL,_n_e_s::core::IMmu_*,_false>._M_head_impl;
  iVar2 = (*pIVar1->_vptr_IMmu[3])(pIVar1,0x4017);
  local_88.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface._0_1_ = (undefined1)iVar2
  ;
  testing::internal::CmpHelperEQ<int,unsigned_char>
            ((internal *)&gtest_ar,"0x40","mmu->read_byte(0x4017)",(int *)local_70[0]._M_pod_data,
             (uchar *)&local_88);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_70);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_mmu.cpp"
               ,0xc5,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
    if ((long *)CONCAT44(local_70[0]._4_4_,local_70[0]._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_70[0]._4_4_,local_70[0]._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  testing::Matcher<n_e_s::core::INesController::Button>::Matcher
            ((Matcher<n_e_s::core::INesController::Button> *)&local_88,Left);
  n_e_s::core::test::MockNesController::gmock_get
            ((MockSpec<bool_(n_e_s::core::INesController::Button)> *)&gtest_ar,
             &this_00->super_MockNesController,
             (Matcher<n_e_s::core::INesController::Button> *)&local_88);
  testing::internal::GetWithoutMatchers();
  pTVar3 = testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::
           InternalExpectedAt((MockSpec<bool_(n_e_s::core::INesController::Button)> *)&gtest_ar,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_mmu.cpp"
                              ,0xc6,"controller2","get(INesController::Button::Left)");
  testing::internal::ReturnAction<bool>::ReturnAction(&local_30,false);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<bool_(n_e_s::core::INesController::Button)> *)local_70,
             (ReturnAction *)&local_30);
  testing::internal::TypedExpectation<bool_(n_e_s::core::INesController::Button)>::WillOnce
            (pTVar3,(Action<bool_(n_e_s::core::INesController::Button)> *)local_70);
  std::_Function_base::~_Function_base((_Function_base *)local_70);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_30.value_.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  testing::internal::MatcherBase<n_e_s::core::INesController::Button>::~MatcherBase
            ((MatcherBase<n_e_s::core::INesController::Button> *)&gtest_ar.message_);
  testing::internal::MatcherBase<n_e_s::core::INesController::Button>::~MatcherBase(&local_88);
  local_70[0]._0_4_ = 0x40;
  pIVar1 = (this->super_NesMmuTest).mmu._M_t.
           super___uniq_ptr_impl<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>._M_t.
           super__Tuple_impl<0UL,_n_e_s::core::IMmu_*,_std::default_delete<n_e_s::core::IMmu>_>.
           super__Head_base<0UL,_n_e_s::core::IMmu_*,_false>._M_head_impl;
  iVar2 = (*pIVar1->_vptr_IMmu[3])(pIVar1,0x4017);
  local_88.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface._0_1_ = (undefined1)iVar2
  ;
  testing::internal::CmpHelperEQ<int,unsigned_char>
            ((internal *)&gtest_ar,"0x40","mmu->read_byte(0x4017)",(int *)local_70[0]._M_pod_data,
             (uchar *)&local_88);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_70);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_mmu.cpp"
               ,200,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
    if ((long *)CONCAT44(local_70[0]._4_4_,local_70[0]._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_70[0]._4_4_,local_70[0]._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  testing::Matcher<n_e_s::core::INesController::Button>::Matcher
            ((Matcher<n_e_s::core::INesController::Button> *)&local_88,Right);
  n_e_s::core::test::MockNesController::gmock_get
            ((MockSpec<bool_(n_e_s::core::INesController::Button)> *)&gtest_ar,
             &this_00->super_MockNesController,
             (Matcher<n_e_s::core::INesController::Button> *)&local_88);
  testing::internal::GetWithoutMatchers();
  pTVar3 = testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::
           InternalExpectedAt((MockSpec<bool_(n_e_s::core::INesController::Button)> *)&gtest_ar,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_mmu.cpp"
                              ,0xc9,"controller2","get(INesController::Button::Right)");
  testing::internal::ReturnAction<bool>::ReturnAction(&local_30,false);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<bool_(n_e_s::core::INesController::Button)> *)local_70,
             (ReturnAction *)&local_30);
  testing::internal::TypedExpectation<bool_(n_e_s::core::INesController::Button)>::WillOnce
            (pTVar3,(Action<bool_(n_e_s::core::INesController::Button)> *)local_70);
  std::_Function_base::~_Function_base((_Function_base *)local_70);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_30.value_.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  testing::internal::MatcherBase<n_e_s::core::INesController::Button>::~MatcherBase
            ((MatcherBase<n_e_s::core::INesController::Button> *)&gtest_ar.message_);
  testing::internal::MatcherBase<n_e_s::core::INesController::Button>::~MatcherBase(&local_88);
  local_70[0]._0_4_ = 0x40;
  pIVar1 = (this->super_NesMmuTest).mmu._M_t.
           super___uniq_ptr_impl<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>._M_t.
           super__Tuple_impl<0UL,_n_e_s::core::IMmu_*,_std::default_delete<n_e_s::core::IMmu>_>.
           super__Head_base<0UL,_n_e_s::core::IMmu_*,_false>._M_head_impl;
  iVar2 = (*pIVar1->_vptr_IMmu[3])(pIVar1,0x4017);
  local_88.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface._0_1_ = (undefined1)iVar2
  ;
  testing::internal::CmpHelperEQ<int,unsigned_char>
            ((internal *)&gtest_ar,"0x40","mmu->read_byte(0x4017)",(int *)local_70[0]._M_pod_data,
             (uchar *)&local_88);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_70);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_mmu.cpp"
               ,0xcb,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
    if ((long *)CONCAT44(local_70[0]._4_4_,local_70[0]._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_70[0]._4_4_,local_70[0]._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_70[0]._0_4_ = 0x41;
  pIVar1 = (this->super_NesMmuTest).mmu._M_t.
           super___uniq_ptr_impl<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>._M_t.
           super__Tuple_impl<0UL,_n_e_s::core::IMmu_*,_std::default_delete<n_e_s::core::IMmu>_>.
           super__Head_base<0UL,_n_e_s::core::IMmu_*,_false>._M_head_impl;
  iVar2 = (*pIVar1->_vptr_IMmu[3])(pIVar1,0x4017);
  local_88.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface._0_1_ = (undefined1)iVar2
  ;
  testing::internal::CmpHelperEQ<int,unsigned_char>
            ((internal *)&gtest_ar,"0x41","mmu->read_byte(0x4017)",(int *)local_70[0]._M_pod_data,
             (uchar *)&local_88);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_70);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_mmu.cpp"
               ,0xcc,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
    if ((long *)CONCAT44(local_70[0]._4_4_,local_70[0]._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_70[0]._4_4_,local_70[0]._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_70[0]._0_4_ = 0x41;
  pIVar1 = (this->super_NesMmuTest).mmu._M_t.
           super___uniq_ptr_impl<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>._M_t.
           super__Tuple_impl<0UL,_n_e_s::core::IMmu_*,_std::default_delete<n_e_s::core::IMmu>_>.
           super__Head_base<0UL,_n_e_s::core::IMmu_*,_false>._M_head_impl;
  iVar2 = (*pIVar1->_vptr_IMmu[3])(pIVar1,0x4017);
  local_88.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface._0_1_ = (undefined1)iVar2
  ;
  testing::internal::CmpHelperEQ<int,unsigned_char>
            ((internal *)&gtest_ar,"0x41","mmu->read_byte(0x4017)",(int *)local_70[0]._M_pod_data,
             (uchar *)&local_88);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_70);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_mmu.cpp"
               ,0xcd,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
    if ((long *)CONCAT44(local_70[0]._4_4_,local_70[0]._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_70[0]._4_4_,local_70[0]._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  pIVar1 = (this->super_NesMmuTest).mmu._M_t.
           super___uniq_ptr_impl<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>._M_t.
           super__Tuple_impl<0UL,_n_e_s::core::IMmu_*,_std::default_delete<n_e_s::core::IMmu>_>.
           super__Head_base<0UL,_n_e_s::core::IMmu_*,_false>._M_head_impl;
  (*pIVar1->_vptr_IMmu[4])(pIVar1,0x4016,1);
  testing::Matcher<n_e_s::core::INesController::Button>::Matcher
            ((Matcher<n_e_s::core::INesController::Button> *)&local_88,A);
  n_e_s::core::test::MockNesController::gmock_get
            ((MockSpec<bool_(n_e_s::core::INesController::Button)> *)&gtest_ar,
             &this_00->super_MockNesController,
             (Matcher<n_e_s::core::INesController::Button> *)&local_88);
  testing::internal::GetWithoutMatchers();
  pTVar3 = testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::
           InternalExpectedAt((MockSpec<bool_(n_e_s::core::INesController::Button)> *)&gtest_ar,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_mmu.cpp"
                              ,0xd3,"controller2","get(INesController::Button::A)");
  testing::internal::ReturnAction<bool>::ReturnAction(&local_30,true);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<bool_(n_e_s::core::INesController::Button)> *)local_70,
             (ReturnAction *)&local_30);
  testing::internal::TypedExpectation<bool_(n_e_s::core::INesController::Button)>::WillOnce
            (pTVar3,(Action<bool_(n_e_s::core::INesController::Button)> *)local_70);
  std::_Function_base::~_Function_base((_Function_base *)local_70);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_30.value_.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  testing::internal::MatcherBase<n_e_s::core::INesController::Button>::~MatcherBase
            ((MatcherBase<n_e_s::core::INesController::Button> *)&gtest_ar.message_);
  testing::internal::MatcherBase<n_e_s::core::INesController::Button>::~MatcherBase(&local_88);
  local_70[0]._0_4_ = 0x41;
  pIVar1 = (this->super_NesMmuTest).mmu._M_t.
           super___uniq_ptr_impl<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>._M_t.
           super__Tuple_impl<0UL,_n_e_s::core::IMmu_*,_std::default_delete<n_e_s::core::IMmu>_>.
           super__Head_base<0UL,_n_e_s::core::IMmu_*,_false>._M_head_impl;
  iVar2 = (*pIVar1->_vptr_IMmu[3])(pIVar1,0x4017);
  local_88.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface._0_1_ = (undefined1)iVar2
  ;
  testing::internal::CmpHelperEQ<int,unsigned_char>
            ((internal *)&gtest_ar,"0x41","mmu->read_byte(0x4017)",(int *)local_70[0]._M_pod_data,
             (uchar *)&local_88);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_70);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_mmu.cpp"
               ,0xd5,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
    if ((long *)CONCAT44(local_70[0]._4_4_,local_70[0]._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_70[0]._4_4_,local_70[0]._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  testing::Matcher<n_e_s::core::INesController::Button>::Matcher
            ((Matcher<n_e_s::core::INesController::Button> *)&local_88,A);
  n_e_s::core::test::MockNesController::gmock_get
            ((MockSpec<bool_(n_e_s::core::INesController::Button)> *)&gtest_ar,
             &this_00->super_MockNesController,
             (Matcher<n_e_s::core::INesController::Button> *)&local_88);
  testing::internal::GetWithoutMatchers();
  pTVar3 = testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::
           InternalExpectedAt((MockSpec<bool_(n_e_s::core::INesController::Button)> *)&gtest_ar,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_mmu.cpp"
                              ,0xd6,"controller2","get(INesController::Button::A)");
  testing::internal::ReturnAction<bool>::ReturnAction(&local_30,false);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<bool_(n_e_s::core::INesController::Button)> *)local_70,
             (ReturnAction *)&local_30);
  testing::internal::TypedExpectation<bool_(n_e_s::core::INesController::Button)>::WillOnce
            (pTVar3,(Action<bool_(n_e_s::core::INesController::Button)> *)local_70);
  std::_Function_base::~_Function_base((_Function_base *)local_70);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_30.value_.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  testing::internal::MatcherBase<n_e_s::core::INesController::Button>::~MatcherBase
            ((MatcherBase<n_e_s::core::INesController::Button> *)&gtest_ar.message_);
  testing::internal::MatcherBase<n_e_s::core::INesController::Button>::~MatcherBase(&local_88);
  local_70[0]._0_4_ = 0x40;
  pIVar1 = (this->super_NesMmuTest).mmu._M_t.
           super___uniq_ptr_impl<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>._M_t.
           super__Tuple_impl<0UL,_n_e_s::core::IMmu_*,_std::default_delete<n_e_s::core::IMmu>_>.
           super__Head_base<0UL,_n_e_s::core::IMmu_*,_false>._M_head_impl;
  iVar2 = (*pIVar1->_vptr_IMmu[3])(pIVar1,0x4017);
  local_88.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface._0_1_ = (undefined1)iVar2
  ;
  testing::internal::CmpHelperEQ<int,unsigned_char>
            ((internal *)&gtest_ar,"0x40","mmu->read_byte(0x4017)",(int *)local_70[0]._M_pod_data,
             (uchar *)&local_88);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_70);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_mmu.cpp"
               ,0xd8,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
    if ((long *)CONCAT44(local_70[0]._4_4_,local_70[0]._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_70[0]._4_4_,local_70[0]._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  pIVar1 = (this->super_NesMmuTest).mmu._M_t.
           super___uniq_ptr_impl<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>._M_t.
           super__Tuple_impl<0UL,_n_e_s::core::IMmu_*,_std::default_delete<n_e_s::core::IMmu>_>.
           super__Head_base<0UL,_n_e_s::core::IMmu_*,_false>._M_head_impl;
  (*pIVar1->_vptr_IMmu[4])(pIVar1,0x4016,0);
  testing::Matcher<n_e_s::core::INesController::Button>::Matcher
            ((Matcher<n_e_s::core::INesController::Button> *)&local_88,A);
  n_e_s::core::test::MockNesController::gmock_get
            ((MockSpec<bool_(n_e_s::core::INesController::Button)> *)&gtest_ar,
             &this_00->super_MockNesController,
             (Matcher<n_e_s::core::INesController::Button> *)&local_88);
  testing::internal::GetWithoutMatchers();
  pTVar3 = testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::
           InternalExpectedAt((MockSpec<bool_(n_e_s::core::INesController::Button)> *)&gtest_ar,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_mmu.cpp"
                              ,0xdd,"controller2","get(INesController::Button::A)");
  testing::internal::ReturnAction<bool>::ReturnAction(&local_30,true);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<bool_(n_e_s::core::INesController::Button)> *)local_70,
             (ReturnAction *)&local_30);
  testing::internal::TypedExpectation<bool_(n_e_s::core::INesController::Button)>::WillOnce
            (pTVar3,(Action<bool_(n_e_s::core::INesController::Button)> *)local_70);
  std::_Function_base::~_Function_base((_Function_base *)local_70);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_30.value_.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  testing::internal::MatcherBase<n_e_s::core::INesController::Button>::~MatcherBase
            ((MatcherBase<n_e_s::core::INesController::Button> *)&gtest_ar.message_);
  testing::internal::MatcherBase<n_e_s::core::INesController::Button>::~MatcherBase(&local_88);
  local_70[0]._0_4_ = 0x41;
  pIVar1 = (this->super_NesMmuTest).mmu._M_t.
           super___uniq_ptr_impl<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>._M_t.
           super__Tuple_impl<0UL,_n_e_s::core::IMmu_*,_std::default_delete<n_e_s::core::IMmu>_>.
           super__Head_base<0UL,_n_e_s::core::IMmu_*,_false>._M_head_impl;
  iVar2 = (*pIVar1->_vptr_IMmu[3])(pIVar1,0x4017);
  local_88.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface._0_1_ = (undefined1)iVar2
  ;
  testing::internal::CmpHelperEQ<int,unsigned_char>
            ((internal *)&gtest_ar,"0x41","mmu->read_byte(0x4017)",(int *)local_70[0]._M_pod_data,
             (uchar *)&local_88);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_70);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_mmu.cpp"
               ,0xdf,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
    if ((long *)CONCAT44(local_70[0]._4_4_,local_70[0]._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_70[0]._4_4_,local_70[0]._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  testing::Matcher<n_e_s::core::INesController::Button>::Matcher
            ((Matcher<n_e_s::core::INesController::Button> *)&local_88,B);
  n_e_s::core::test::MockNesController::gmock_get
            ((MockSpec<bool_(n_e_s::core::INesController::Button)> *)&gtest_ar,
             &this_00->super_MockNesController,
             (Matcher<n_e_s::core::INesController::Button> *)&local_88);
  testing::internal::GetWithoutMatchers();
  pTVar3 = testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::
           InternalExpectedAt((MockSpec<bool_(n_e_s::core::INesController::Button)> *)&gtest_ar,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_mmu.cpp"
                              ,0xe0,"controller2","get(INesController::Button::B)");
  testing::internal::ReturnAction<bool>::ReturnAction(&local_30,true);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<bool_(n_e_s::core::INesController::Button)> *)local_70,
             (ReturnAction *)&local_30);
  testing::internal::TypedExpectation<bool_(n_e_s::core::INesController::Button)>::WillOnce
            (pTVar3,(Action<bool_(n_e_s::core::INesController::Button)> *)local_70);
  std::_Function_base::~_Function_base((_Function_base *)local_70);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_30.value_.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  testing::internal::MatcherBase<n_e_s::core::INesController::Button>::~MatcherBase
            ((MatcherBase<n_e_s::core::INesController::Button> *)&gtest_ar.message_);
  testing::internal::MatcherBase<n_e_s::core::INesController::Button>::~MatcherBase(&local_88);
  local_70[0]._0_4_ = 0x41;
  pIVar1 = (this->super_NesMmuTest).mmu._M_t.
           super___uniq_ptr_impl<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>._M_t.
           super__Tuple_impl<0UL,_n_e_s::core::IMmu_*,_std::default_delete<n_e_s::core::IMmu>_>.
           super__Head_base<0UL,_n_e_s::core::IMmu_*,_false>._M_head_impl;
  iVar2 = (*pIVar1->_vptr_IMmu[3])(pIVar1,0x4017);
  local_88.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface._0_1_ = (undefined1)iVar2
  ;
  testing::internal::CmpHelperEQ<int,unsigned_char>
            ((internal *)&gtest_ar,"0x41","mmu->read_byte(0x4017)",(int *)local_70[0]._M_pod_data,
             (uchar *)&local_88);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_70);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_mmu.cpp"
               ,0xe2,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
    if ((long *)CONCAT44(local_70[0]._4_4_,local_70[0]._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_70[0]._4_4_,local_70[0]._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  testing::Matcher<n_e_s::core::INesController::Button>::Matcher
            ((Matcher<n_e_s::core::INesController::Button> *)&local_88,Select);
  n_e_s::core::test::MockNesController::gmock_get
            ((MockSpec<bool_(n_e_s::core::INesController::Button)> *)&gtest_ar,
             &this_00->super_MockNesController,
             (Matcher<n_e_s::core::INesController::Button> *)&local_88);
  testing::internal::GetWithoutMatchers();
  pTVar3 = testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::
           InternalExpectedAt((MockSpec<bool_(n_e_s::core::INesController::Button)> *)&gtest_ar,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_mmu.cpp"
                              ,0xe3,"controller2","get(INesController::Button::Select)");
  testing::internal::ReturnAction<bool>::ReturnAction(&local_30,true);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<bool_(n_e_s::core::INesController::Button)> *)local_70,
             (ReturnAction *)&local_30);
  testing::internal::TypedExpectation<bool_(n_e_s::core::INesController::Button)>::WillOnce
            (pTVar3,(Action<bool_(n_e_s::core::INesController::Button)> *)local_70);
  std::_Function_base::~_Function_base((_Function_base *)local_70);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_30.value_.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  testing::internal::MatcherBase<n_e_s::core::INesController::Button>::~MatcherBase
            ((MatcherBase<n_e_s::core::INesController::Button> *)&gtest_ar.message_);
  testing::internal::MatcherBase<n_e_s::core::INesController::Button>::~MatcherBase(&local_88);
  local_70[0]._0_4_ = 0x41;
  pIVar1 = (this->super_NesMmuTest).mmu._M_t.
           super___uniq_ptr_impl<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>._M_t.
           super__Tuple_impl<0UL,_n_e_s::core::IMmu_*,_std::default_delete<n_e_s::core::IMmu>_>.
           super__Head_base<0UL,_n_e_s::core::IMmu_*,_false>._M_head_impl;
  iVar2 = (*pIVar1->_vptr_IMmu[3])(pIVar1,0x4017);
  local_88.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface._0_1_ = (undefined1)iVar2
  ;
  testing::internal::CmpHelperEQ<int,unsigned_char>
            ((internal *)&gtest_ar,"0x41","mmu->read_byte(0x4017)",(int *)local_70[0]._M_pod_data,
             (uchar *)&local_88);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_70);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_mmu.cpp"
               ,0xe5,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
    if ((long *)CONCAT44(local_70[0]._4_4_,local_70[0]._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_70[0]._4_4_,local_70[0]._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  testing::Matcher<n_e_s::core::INesController::Button>::Matcher
            ((Matcher<n_e_s::core::INesController::Button> *)&local_88,Start);
  n_e_s::core::test::MockNesController::gmock_get
            ((MockSpec<bool_(n_e_s::core::INesController::Button)> *)&gtest_ar,
             &this_00->super_MockNesController,
             (Matcher<n_e_s::core::INesController::Button> *)&local_88);
  testing::internal::GetWithoutMatchers();
  pTVar3 = testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::
           InternalExpectedAt((MockSpec<bool_(n_e_s::core::INesController::Button)> *)&gtest_ar,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_mmu.cpp"
                              ,0xe6,"controller2","get(INesController::Button::Start)");
  testing::internal::ReturnAction<bool>::ReturnAction(&local_30,true);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<bool_(n_e_s::core::INesController::Button)> *)local_70,
             (ReturnAction *)&local_30);
  testing::internal::TypedExpectation<bool_(n_e_s::core::INesController::Button)>::WillOnce
            (pTVar3,(Action<bool_(n_e_s::core::INesController::Button)> *)local_70);
  std::_Function_base::~_Function_base((_Function_base *)local_70);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_30.value_.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  testing::internal::MatcherBase<n_e_s::core::INesController::Button>::~MatcherBase
            ((MatcherBase<n_e_s::core::INesController::Button> *)&gtest_ar.message_);
  testing::internal::MatcherBase<n_e_s::core::INesController::Button>::~MatcherBase(&local_88);
  local_70[0]._0_4_ = 0x41;
  pIVar1 = (this->super_NesMmuTest).mmu._M_t.
           super___uniq_ptr_impl<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>._M_t.
           super__Tuple_impl<0UL,_n_e_s::core::IMmu_*,_std::default_delete<n_e_s::core::IMmu>_>.
           super__Head_base<0UL,_n_e_s::core::IMmu_*,_false>._M_head_impl;
  iVar2 = (*pIVar1->_vptr_IMmu[3])(pIVar1,0x4017);
  local_88.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface._0_1_ = (undefined1)iVar2
  ;
  testing::internal::CmpHelperEQ<int,unsigned_char>
            ((internal *)&gtest_ar,"0x41","mmu->read_byte(0x4017)",(int *)local_70[0]._M_pod_data,
             (uchar *)&local_88);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_70);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_mmu.cpp"
               ,0xe8,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
    if ((long *)CONCAT44(local_70[0]._4_4_,local_70[0]._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_70[0]._4_4_,local_70[0]._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  testing::Matcher<n_e_s::core::INesController::Button>::Matcher
            ((Matcher<n_e_s::core::INesController::Button> *)&local_88,Up);
  n_e_s::core::test::MockNesController::gmock_get
            ((MockSpec<bool_(n_e_s::core::INesController::Button)> *)&gtest_ar,
             &this_00->super_MockNesController,
             (Matcher<n_e_s::core::INesController::Button> *)&local_88);
  testing::internal::GetWithoutMatchers();
  pTVar3 = testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::
           InternalExpectedAt((MockSpec<bool_(n_e_s::core::INesController::Button)> *)&gtest_ar,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_mmu.cpp"
                              ,0xe9,"controller2","get(INesController::Button::Up)");
  testing::internal::ReturnAction<bool>::ReturnAction(&local_30,true);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<bool_(n_e_s::core::INesController::Button)> *)local_70,
             (ReturnAction *)&local_30);
  testing::internal::TypedExpectation<bool_(n_e_s::core::INesController::Button)>::WillOnce
            (pTVar3,(Action<bool_(n_e_s::core::INesController::Button)> *)local_70);
  std::_Function_base::~_Function_base((_Function_base *)local_70);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_30.value_.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  testing::internal::MatcherBase<n_e_s::core::INesController::Button>::~MatcherBase
            ((MatcherBase<n_e_s::core::INesController::Button> *)&gtest_ar.message_);
  testing::internal::MatcherBase<n_e_s::core::INesController::Button>::~MatcherBase(&local_88);
  local_70[0]._0_4_ = 0x41;
  pIVar1 = (this->super_NesMmuTest).mmu._M_t.
           super___uniq_ptr_impl<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>._M_t.
           super__Tuple_impl<0UL,_n_e_s::core::IMmu_*,_std::default_delete<n_e_s::core::IMmu>_>.
           super__Head_base<0UL,_n_e_s::core::IMmu_*,_false>._M_head_impl;
  iVar2 = (*pIVar1->_vptr_IMmu[3])(pIVar1,0x4017);
  local_88.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface._0_1_ = (undefined1)iVar2
  ;
  testing::internal::CmpHelperEQ<int,unsigned_char>
            ((internal *)&gtest_ar,"0x41","mmu->read_byte(0x4017)",(int *)local_70[0]._M_pod_data,
             (uchar *)&local_88);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_70);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_mmu.cpp"
               ,0xeb,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
    if ((long *)CONCAT44(local_70[0]._4_4_,local_70[0]._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_70[0]._4_4_,local_70[0]._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  testing::Matcher<n_e_s::core::INesController::Button>::Matcher
            ((Matcher<n_e_s::core::INesController::Button> *)&local_88,Down);
  n_e_s::core::test::MockNesController::gmock_get
            ((MockSpec<bool_(n_e_s::core::INesController::Button)> *)&gtest_ar,
             &this_00->super_MockNesController,
             (Matcher<n_e_s::core::INesController::Button> *)&local_88);
  testing::internal::GetWithoutMatchers();
  pTVar3 = testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::
           InternalExpectedAt((MockSpec<bool_(n_e_s::core::INesController::Button)> *)&gtest_ar,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_mmu.cpp"
                              ,0xec,"controller2","get(INesController::Button::Down)");
  testing::internal::ReturnAction<bool>::ReturnAction(&local_30,true);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<bool_(n_e_s::core::INesController::Button)> *)local_70,
             (ReturnAction *)&local_30);
  testing::internal::TypedExpectation<bool_(n_e_s::core::INesController::Button)>::WillOnce
            (pTVar3,(Action<bool_(n_e_s::core::INesController::Button)> *)local_70);
  std::_Function_base::~_Function_base((_Function_base *)local_70);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_30.value_.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  testing::internal::MatcherBase<n_e_s::core::INesController::Button>::~MatcherBase
            ((MatcherBase<n_e_s::core::INesController::Button> *)&gtest_ar.message_);
  testing::internal::MatcherBase<n_e_s::core::INesController::Button>::~MatcherBase(&local_88);
  local_70[0]._0_4_ = 0x41;
  pIVar1 = (this->super_NesMmuTest).mmu._M_t.
           super___uniq_ptr_impl<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>._M_t.
           super__Tuple_impl<0UL,_n_e_s::core::IMmu_*,_std::default_delete<n_e_s::core::IMmu>_>.
           super__Head_base<0UL,_n_e_s::core::IMmu_*,_false>._M_head_impl;
  iVar2 = (*pIVar1->_vptr_IMmu[3])(pIVar1,0x4017);
  local_88.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface._0_1_ = (undefined1)iVar2
  ;
  testing::internal::CmpHelperEQ<int,unsigned_char>
            ((internal *)&gtest_ar,"0x41","mmu->read_byte(0x4017)",(int *)local_70[0]._M_pod_data,
             (uchar *)&local_88);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_70);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_mmu.cpp"
               ,0xee,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
    if ((long *)CONCAT44(local_70[0]._4_4_,local_70[0]._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_70[0]._4_4_,local_70[0]._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  testing::Matcher<n_e_s::core::INesController::Button>::Matcher
            ((Matcher<n_e_s::core::INesController::Button> *)&local_88,Left);
  n_e_s::core::test::MockNesController::gmock_get
            ((MockSpec<bool_(n_e_s::core::INesController::Button)> *)&gtest_ar,
             &this_00->super_MockNesController,
             (Matcher<n_e_s::core::INesController::Button> *)&local_88);
  testing::internal::GetWithoutMatchers();
  pTVar3 = testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::
           InternalExpectedAt((MockSpec<bool_(n_e_s::core::INesController::Button)> *)&gtest_ar,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_mmu.cpp"
                              ,0xef,"controller2","get(INesController::Button::Left)");
  testing::internal::ReturnAction<bool>::ReturnAction(&local_30,true);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<bool_(n_e_s::core::INesController::Button)> *)local_70,
             (ReturnAction *)&local_30);
  testing::internal::TypedExpectation<bool_(n_e_s::core::INesController::Button)>::WillOnce
            (pTVar3,(Action<bool_(n_e_s::core::INesController::Button)> *)local_70);
  std::_Function_base::~_Function_base((_Function_base *)local_70);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_30.value_.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  testing::internal::MatcherBase<n_e_s::core::INesController::Button>::~MatcherBase
            ((MatcherBase<n_e_s::core::INesController::Button> *)&gtest_ar.message_);
  testing::internal::MatcherBase<n_e_s::core::INesController::Button>::~MatcherBase(&local_88);
  local_70[0]._0_4_ = 0x41;
  pIVar1 = (this->super_NesMmuTest).mmu._M_t.
           super___uniq_ptr_impl<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>._M_t.
           super__Tuple_impl<0UL,_n_e_s::core::IMmu_*,_std::default_delete<n_e_s::core::IMmu>_>.
           super__Head_base<0UL,_n_e_s::core::IMmu_*,_false>._M_head_impl;
  iVar2 = (*pIVar1->_vptr_IMmu[3])(pIVar1,0x4017);
  local_88.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface._0_1_ = (undefined1)iVar2
  ;
  testing::internal::CmpHelperEQ<int,unsigned_char>
            ((internal *)&gtest_ar,"0x41","mmu->read_byte(0x4017)",(int *)local_70[0]._M_pod_data,
             (uchar *)&local_88);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_70);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_mmu.cpp"
               ,0xf1,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
    if ((long *)CONCAT44(local_70[0]._4_4_,local_70[0]._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_70[0]._4_4_,local_70[0]._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  testing::Matcher<n_e_s::core::INesController::Button>::Matcher
            ((Matcher<n_e_s::core::INesController::Button> *)&local_88,Right);
  n_e_s::core::test::MockNesController::gmock_get
            ((MockSpec<bool_(n_e_s::core::INesController::Button)> *)&gtest_ar,
             &this_00->super_MockNesController,
             (Matcher<n_e_s::core::INesController::Button> *)&local_88);
  testing::internal::GetWithoutMatchers();
  pTVar3 = testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::
           InternalExpectedAt((MockSpec<bool_(n_e_s::core::INesController::Button)> *)&gtest_ar,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_mmu.cpp"
                              ,0xf2,"controller2","get(INesController::Button::Right)");
  testing::internal::ReturnAction<bool>::ReturnAction(&local_30,true);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<bool_(n_e_s::core::INesController::Button)> *)local_70,
             (ReturnAction *)&local_30);
  testing::internal::TypedExpectation<bool_(n_e_s::core::INesController::Button)>::WillOnce
            (pTVar3,(Action<bool_(n_e_s::core::INesController::Button)> *)local_70);
  std::_Function_base::~_Function_base((_Function_base *)local_70);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_30.value_.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  testing::internal::MatcherBase<n_e_s::core::INesController::Button>::~MatcherBase
            ((MatcherBase<n_e_s::core::INesController::Button> *)&gtest_ar.message_);
  testing::internal::MatcherBase<n_e_s::core::INesController::Button>::~MatcherBase(&local_88);
  local_70[0]._0_4_ = 0x41;
  pIVar1 = (this->super_NesMmuTest).mmu._M_t.
           super___uniq_ptr_impl<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>._M_t.
           super__Tuple_impl<0UL,_n_e_s::core::IMmu_*,_std::default_delete<n_e_s::core::IMmu>_>.
           super__Head_base<0UL,_n_e_s::core::IMmu_*,_false>._M_head_impl;
  iVar2 = (*pIVar1->_vptr_IMmu[3])(pIVar1,0x4017);
  local_88.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface._0_1_ = (undefined1)iVar2
  ;
  testing::internal::CmpHelperEQ<int,unsigned_char>
            ((internal *)&gtest_ar,"0x41","mmu->read_byte(0x4017)",(int *)local_70[0]._M_pod_data,
             (uchar *)&local_88);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_70);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_mmu.cpp"
               ,0xf4,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
    if ((long *)CONCAT44(local_70[0]._4_4_,local_70[0]._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_70[0]._4_4_,local_70[0]._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_70[0]._0_4_ = 0x41;
  pIVar1 = (this->super_NesMmuTest).mmu._M_t.
           super___uniq_ptr_impl<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>._M_t.
           super__Tuple_impl<0UL,_n_e_s::core::IMmu_*,_std::default_delete<n_e_s::core::IMmu>_>.
           super__Head_base<0UL,_n_e_s::core::IMmu_*,_false>._M_head_impl;
  iVar2 = (*pIVar1->_vptr_IMmu[3])(pIVar1,0x4017);
  local_88.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface._0_1_ = (undefined1)iVar2
  ;
  testing::internal::CmpHelperEQ<int,unsigned_char>
            ((internal *)&gtest_ar,"0x41","mmu->read_byte(0x4017)",(int *)local_70[0]._M_pod_data,
             (uchar *)&local_88);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_70);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_mmu.cpp"
               ,0xf5,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
    if ((long *)CONCAT44(local_70[0]._4_4_,local_70[0]._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_70[0]._4_4_,local_70[0]._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_70[0]._0_4_ = 0x41;
  pIVar1 = (this->super_NesMmuTest).mmu._M_t.
           super___uniq_ptr_impl<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>._M_t.
           super__Tuple_impl<0UL,_n_e_s::core::IMmu_*,_std::default_delete<n_e_s::core::IMmu>_>.
           super__Head_base<0UL,_n_e_s::core::IMmu_*,_false>._M_head_impl;
  iVar2 = (*pIVar1->_vptr_IMmu[3])(pIVar1,0x4017);
  local_88.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface._0_1_ = (undefined1)iVar2
  ;
  testing::internal::CmpHelperEQ<int,unsigned_char>
            ((internal *)&gtest_ar,"0x41","mmu->read_byte(0x4017)",(int *)local_70[0]._M_pod_data,
             (uchar *)&local_88);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_70);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_mmu.cpp"
               ,0xf6,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
    if ((long *)CONCAT44(local_70[0]._4_4_,local_70[0]._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_70[0]._4_4_,local_70[0]._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(NesMmuTest, controller_2) {
    // No button pressed, extra reads at end to make sure controller is not read
    EXPECT_CALL(controller2, get(INesController::Button::A))
            .WillOnce(testing::Return(false));
    EXPECT_EQ(0x40, mmu->read_byte(0x4017));
    EXPECT_CALL(controller2, get(INesController::Button::B))
            .WillOnce(testing::Return(false));
    EXPECT_EQ(0x40, mmu->read_byte(0x4017));
    EXPECT_CALL(controller2, get(INesController::Button::Select))
            .WillOnce(testing::Return(false));
    EXPECT_EQ(0x40, mmu->read_byte(0x4017));
    EXPECT_CALL(controller2, get(INesController::Button::Start))
            .WillOnce(testing::Return(false));
    EXPECT_EQ(0x40, mmu->read_byte(0x4017));
    EXPECT_CALL(controller2, get(INesController::Button::Up))
            .WillOnce(testing::Return(false));
    EXPECT_EQ(0x40, mmu->read_byte(0x4017));
    EXPECT_CALL(controller2, get(INesController::Button::Down))
            .WillOnce(testing::Return(false));
    EXPECT_EQ(0x40, mmu->read_byte(0x4017));
    EXPECT_CALL(controller2, get(INesController::Button::Left))
            .WillOnce(testing::Return(false));
    EXPECT_EQ(0x40, mmu->read_byte(0x4017));
    EXPECT_CALL(controller2, get(INesController::Button::Right))
            .WillOnce(testing::Return(false));
    EXPECT_EQ(0x40, mmu->read_byte(0x4017));
    EXPECT_EQ(0x41, mmu->read_byte(0x4017));
    EXPECT_EQ(0x41, mmu->read_byte(0x4017));

    // Latch controller button states by toggling strobe (0x4016, bit 0), now
    // new controller read is possible (while stope is high, button A's state
    // should be returned on read)
    mmu->write_byte(0x4016, 0x01);
    EXPECT_CALL(controller2, get(INesController::Button::A))
            .WillOnce(testing::Return(true));
    EXPECT_EQ(0x41, mmu->read_byte(0x4017));
    EXPECT_CALL(controller2, get(INesController::Button::A))
            .WillOnce(testing::Return(false));
    EXPECT_EQ(0x40, mmu->read_byte(0x4017));
    mmu->write_byte(0x4016, 0x00);

    // All buttons pressed, extra reads at end to make sure controller is not
    // read
    EXPECT_CALL(controller2, get(INesController::Button::A))
            .WillOnce(testing::Return(true));
    EXPECT_EQ(0x41, mmu->read_byte(0x4017));
    EXPECT_CALL(controller2, get(INesController::Button::B))
            .WillOnce(testing::Return(true));
    EXPECT_EQ(0x41, mmu->read_byte(0x4017));
    EXPECT_CALL(controller2, get(INesController::Button::Select))
            .WillOnce(testing::Return(true));
    EXPECT_EQ(0x41, mmu->read_byte(0x4017));
    EXPECT_CALL(controller2, get(INesController::Button::Start))
            .WillOnce(testing::Return(true));
    EXPECT_EQ(0x41, mmu->read_byte(0x4017));
    EXPECT_CALL(controller2, get(INesController::Button::Up))
            .WillOnce(testing::Return(true));
    EXPECT_EQ(0x41, mmu->read_byte(0x4017));
    EXPECT_CALL(controller2, get(INesController::Button::Down))
            .WillOnce(testing::Return(true));
    EXPECT_EQ(0x41, mmu->read_byte(0x4017));
    EXPECT_CALL(controller2, get(INesController::Button::Left))
            .WillOnce(testing::Return(true));
    EXPECT_EQ(0x41, mmu->read_byte(0x4017));
    EXPECT_CALL(controller2, get(INesController::Button::Right))
            .WillOnce(testing::Return(true));
    EXPECT_EQ(0x41, mmu->read_byte(0x4017));
    EXPECT_EQ(0x41, mmu->read_byte(0x4017));
    EXPECT_EQ(0x41, mmu->read_byte(0x4017));
}